

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dconnected.cpp
# Opt level: O2

void __thiscall
DReachabilityPropagator::DReachabilityPropagator
          (DReachabilityPropagator *this,int _r,vec<BoolView> *_vs,vec<BoolView> *_es,
          vec<vec<int>_> *_in,vec<vec<int>_> *_out,vec<vec<int>_> *_en)

{
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *pvVar1;
  _Rb_tree_header *p_Var2;
  BoolView *this_00;
  size_t __n;
  int _r_00;
  pointer pvVar3;
  int *piVar4;
  BoolView *pBVar5;
  bool bVar6;
  pointer pvVar7;
  Tint *__s;
  Tint *__s_00;
  FilteredLT *this_01;
  ulong uVar8;
  uint i;
  uint uVar9;
  size_type sVar10;
  size_t sVar11;
  long lVar12;
  uint j;
  ulong uVar13;
  int i_6;
  int i_2;
  long lVar14;
  allocator_type local_109;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  in;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ou;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  en;
  _Vector_base<int,_std::allocator<int>_> local_98;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_78;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_60;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_48;
  
  GraphPropagator::GraphPropagator(&this->super_GraphPropagator,_vs,_es,_en);
  (this->super_GraphPropagator).super_Propagator._vptr_Propagator =
       (_func_int **)&PTR__DReachabilityPropagator_001f3a90;
  this->lt = (FilteredLT *)0x0;
  this->root = _r;
  (this->new_node)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  p_Var2 = &(this->new_node)._M_t._M_impl.super__Rb_tree_header;
  (this->new_node)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->nodes2edge).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->nodes2edge).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->nodes2edge).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->in_nodes_tsize = 0;
  this->in_nodes_size = 0;
  (this->in_nodes_list).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->in_nodes_list).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->in_nodes_list).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->new_node)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (this->new_node)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  (this->new_node)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var2 = &(this->rem_node)._M_t._M_impl.super__Rb_tree_header;
  (this->rem_node)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->rem_node)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->rem_node)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (this->rem_node)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  (this->rem_node)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var2 = &(this->new_edge)._M_t._M_impl.super__Rb_tree_header;
  (this->new_edge)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->new_edge)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->new_edge)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (this->new_edge)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  (this->new_edge)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->rem_edge)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  p_Var2 = &(this->rem_edge)._M_t._M_impl.super__Rb_tree_header;
  (this->rem_edge)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->rem_edge)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (this->rem_edge)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  (this->ou).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ou).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ou).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->in).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->in).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->rem_edge)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->in).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  in.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  in.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  in.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&en,(ulong)_in->sz,(value_type *)&in,(allocator_type *)&ou);
  pvVar1 = &(this->super_GraphPropagator).adj;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::_M_move_assign(pvVar1,&en);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&en);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&in);
  for (uVar8 = 0; uVar13 = (ulong)_in->sz, uVar8 < uVar13; uVar8 = uVar8 + 1) {
    lVar12 = 0;
    for (uVar13 = 0; uVar13 < _in->data[uVar8].sz; uVar13 = uVar13 + 1) {
      std::vector<int,_std::allocator<int>_>::push_back
                ((pvVar1->
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + uVar8,
                 (value_type_conflict1 *)((long)_in->data[uVar8].data + lVar12));
      lVar12 = lVar12 + 4;
    }
    lVar12 = 0;
    for (uVar13 = 0; uVar13 < _out->data[uVar8].sz; uVar13 = uVar13 + 1) {
      std::vector<int,_std::allocator<int>_>::push_back
                ((pvVar1->
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + uVar8,
                 (value_type_conflict1 *)((long)_out->data[uVar8].data + lVar12));
      lVar12 = lVar12 + 4;
    }
  }
  for (uVar8 = 0; uVar8 < uVar13; uVar8 = uVar8 + 1) {
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::emplace_back<>(&this->in);
    lVar12 = 0;
    for (uVar13 = 0; uVar13 < _in->data[uVar8].sz; uVar13 = uVar13 + 1) {
      std::vector<int,_std::allocator<int>_>::push_back
                ((this->in).
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar8,
                 (value_type_conflict1 *)((long)_in->data[uVar8].data + lVar12));
      lVar12 = lVar12 + 4;
    }
    uVar13 = (ulong)_in->sz;
  }
  for (uVar8 = 0; uVar8 < _out->sz; uVar8 = uVar8 + 1) {
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::emplace_back<>(&this->ou);
    lVar12 = 0;
    for (uVar13 = 0; uVar13 < _out->data[uVar8].sz; uVar13 = uVar13 + 1) {
      std::vector<int,_std::allocator<int>_>::push_back
                ((this->ou).
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar8,
                 (value_type_conflict1 *)((long)_out->data[uVar8].data + lVar12));
      lVar12 = lVar12 + 4;
    }
  }
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&en,(long)(int)(this->super_GraphPropagator).vs.sz,(allocator_type *)&in);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::_M_move_assign(&this->nodes2edge,(_Vector_base<int,_std::allocator<int>_> *)&en);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&en);
  lVar12 = 0;
  for (lVar14 = 0; sVar10 = (size_type)(int)(this->super_GraphPropagator).vs.sz,
      lVar14 < (long)sVar10; lVar14 = lVar14 + 1) {
    in.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT44(in.
                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start._4_4_,0xffffffff);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&en,sVar10,(value_type_conflict1 *)&in,
               (allocator_type *)&ou);
    std::vector<int,_std::allocator<int>_>::_M_move_assign
              ((vector<int,_std::allocator<int>_> *)
               ((long)&(((this->nodes2edge).
                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start + lVar12),
               (_Vector_base<int,_std::allocator<int>_> *)&en);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&en);
    lVar12 = lVar12 + 0x18;
  }
  pvVar7 = (this->super_GraphPropagator).endnodes.
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar3 = (this->nodes2edge).
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar12 = 0;
  while( true ) {
    uVar9 = (this->super_GraphPropagator).es.sz;
    sVar10 = (size_type)(int)uVar9;
    if ((long)sVar10 <= lVar12) break;
    piVar4 = (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
             ._M_start;
    *(int *)(*(long *)&pvVar3[*piVar4].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data + (long)piVar4[1] * 4) = (int)lVar12;
    lVar12 = lVar12 + 1;
    pvVar7 = pvVar7 + 1;
  }
  lVar12 = (long)(int)(this->super_GraphPropagator).vs.sz;
  __n = lVar12 * 4;
  sVar11 = __n;
  if (lVar12 < 0) {
    sVar11 = 0xffffffffffffffff;
  }
  __s = (Tint *)operator_new__(sVar11);
  this->last_state_n = __s;
  uVar8 = 0xffffffffffffffff;
  if (-1 < (int)uVar9) {
    uVar8 = sVar10 * 4;
  }
  __s_00 = (Tint *)operator_new__(uVar8);
  this->last_state_e = __s_00;
  memset(__s,2,__n);
  memset(__s_00,2,sVar10 * 4);
  in.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  in.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  in.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&en,sVar10,(value_type *)&in,(allocator_type *)&ou);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&in);
  for (uVar8 = 0; uVar8 < _en->sz; uVar8 = uVar8 + 1) {
    lVar12 = 0;
    for (uVar13 = 0; uVar13 < _en->data[uVar8].sz; uVar13 = uVar13 + 1) {
      std::vector<int,_std::allocator<int>_>::push_back
                (en.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar8,
                 (value_type_conflict1 *)((long)_en->data[uVar8].data + lVar12));
      lVar12 = lVar12 + 4;
    }
  }
  ou.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ou.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ou.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&in,(long)(int)(this->super_GraphPropagator).vs.sz,(value_type *)&ou,
           (allocator_type *)&local_98);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&ou);
  for (uVar8 = 0; uVar8 < _in->sz; uVar8 = uVar8 + 1) {
    lVar12 = 0;
    for (uVar13 = 0; uVar13 < _in->data[uVar8].sz; uVar13 = uVar13 + 1) {
      std::vector<int,_std::allocator<int>_>::push_back
                (in.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar8,
                 (value_type_conflict1 *)((long)_in->data[uVar8].data + lVar12));
      lVar12 = lVar12 + 4;
    }
  }
  local_98._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&ou,(long)(int)(this->super_GraphPropagator).vs.sz,(value_type *)&local_98,&local_109);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_98);
  for (uVar8 = 0; uVar8 < _out->sz; uVar8 = uVar8 + 1) {
    lVar12 = 0;
    for (uVar13 = 0; uVar13 < _out->data[uVar8].sz; uVar13 = uVar13 + 1) {
      std::vector<int,_std::allocator<int>_>::push_back
                (ou.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar8,
                 (value_type_conflict1 *)((long)_out->data[uVar8].data + lVar12));
      lVar12 = lVar12 + 4;
    }
  }
  this_01 = (FilteredLT *)operator_new(0x100);
  _r_00 = this->root;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&local_48,&en);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&local_60,&in);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&local_78,&ou);
  FilteredLT::FilteredLT(this_01,&this->super_GraphPropagator,_r_00,&local_48,&local_60,&local_78);
  this->lt = this_01;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_78);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_60);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_48);
  lVar14 = 0;
  for (lVar12 = 0; lVar12 < (int)(this->super_GraphPropagator).vs.sz; lVar12 = lVar12 + 1) {
    BoolView::attach((BoolView *)
                     ((long)&(((this->super_GraphPropagator).vs.data)->super_Var).super_Branching.
                             _vptr_Branching + lVar14),(Propagator *)this,(int)lVar12,6);
    lVar14 = lVar14 + 0x10;
  }
  lVar12 = 0;
  for (lVar14 = 0; lVar14 < (int)(this->super_GraphPropagator).es.sz; lVar14 = lVar14 + 1) {
    BoolView::attach((BoolView *)
                     ((long)&(((this->super_GraphPropagator).es.data)->super_Var).super_Branching.
                             _vptr_Branching + lVar12),(Propagator *)this,
                     (this->super_GraphPropagator).vs.sz + (int)lVar14,6);
    lVar12 = lVar12 + 0x10;
  }
  pBVar5 = (this->super_GraphPropagator).vs.data;
  this_00 = pBVar5 + (uint)this->root;
  if (sat.assigns.data[(uint)pBVar5[(uint)this->root].v] == '\0') {
    BoolView::setVal(this_00,true,(Reason)0x0);
  }
  else {
    bVar6 = BoolView::isFalse(this_00);
    if (bVar6) goto LAB_001a5bc8;
  }
  Tint::operator=(this->last_state_n + this->root,0);
  add_innode(this,this->root);
  for (uVar9 = 0; (int)uVar9 < (int)(this->super_GraphPropagator).vs.sz; uVar9 = uVar9 + 1) {
    (*(this->super_GraphPropagator).super_Propagator._vptr_Propagator[0xe])(this,(ulong)uVar9);
  }
LAB_001a5bc8:
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&ou);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&in);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&en);
  return;
}

Assistant:

DReachabilityPropagator::DReachabilityPropagator(int _r, vec<BoolView>& _vs, vec<BoolView>& _es,
																								 vec<vec<edge_id> >& _in, vec<vec<edge_id> >& _out,
																								 vec<vec<int> >& _en)
		: GraphPropagator(_vs, _es, _en), root(_r), in_nodes_tsize(0) {
	adj = std::vector<std::vector<int> >(_in.size(), std::vector<int>());
	for (unsigned int i = 0; i < _in.size(); i++) {
		for (unsigned int j = 0; j < _in[i].size(); j++) {
			adj[i].push_back(_in[i][j]);
		}
		for (unsigned int j = 0; j < _out[i].size(); j++) {
			adj[i].push_back(_out[i][j]);
		}
	}

	for (unsigned int i = 0; i < _in.size(); i++) {
		if (DEBUG) {
			std::cout << "Incident to " << i << ": ";
		}
		in.emplace_back();
		for (unsigned int j = 0; j < _in[i].size(); j++) {
			in[i].push_back(_in[i][j]);
			if (DEBUG) {
				std::cout << _in[i][j] << ", ";
			}
		}
		if (DEBUG) {
			std::cout << '\n';
		}
	}

	for (unsigned int i = 0; i < _out.size(); i++) {
		ou.emplace_back();
		if (DEBUG) {
			std::cout << "Outgoing from " << i << ": ";
		}
		for (unsigned int j = 0; j < _out[i].size(); j++) {
			ou[i].push_back(_out[i][j]);
			if (DEBUG) {
				std::cout << _out[i][j] << ", ";
			}
		}
		if (DEBUG) {
			std::cout << '\n';
		}
	}

	nodes2edge = std::vector<std::vector<int> >(nbNodes());
	for (int i = 0; i < nbNodes(); i++) {
		nodes2edge[i] = std::vector<int>(nbNodes(), -1);
	}
	for (int e = 0; e < nbEdges(); e++) {
		nodes2edge[getTail(e)][getHead(e)] = e;
	}

	last_state_n = new Tint[nbNodes()];
	last_state_e = new Tint[nbEdges()];
	memset((int*)last_state_n, UNK, sizeof(Tint) * nbNodes());
	memset((int*)last_state_e, UNK, sizeof(Tint) * nbEdges());

	std::vector<std::vector<int> > en(nbEdges(), std::vector<int>());
	for (unsigned int i = 0; i < _en.size(); i++) {
		for (unsigned int j = 0; j < _en[i].size(); j++) {
			en[i].push_back(_en[i][j]);
		}
	}

	std::vector<std::vector<int> > in(nbNodes(), std::vector<int>());
	for (unsigned int i = 0; i < _in.size(); i++) {
		for (unsigned int j = 0; j < _in[i].size(); j++) {
			in[i].push_back(_in[i][j]);
		}
	}

	std::vector<std::vector<int> > ou(nbNodes(), std::vector<int>());
	for (unsigned int i = 0; i < _out.size(); i++) {
		for (unsigned int j = 0; j < _out[i].size(); j++) {
			ou[i].push_back(_out[i][j]);
		}
	}

	lt = new FilteredLT(this, get_root_idx(), en, in, ou);

	for (int i = 0; i < nbNodes(); i++) {
		getNodeVar(i).attach(this, i, EVENT_LU);
	}

	for (int j = 0; j < nbEdges(); j++) {
		getEdgeVar(j).attach(this, nbNodes() + j, EVENT_LU);
	}

	if (!getNodeVar(root).isFixed()) {
		getNodeVar(root).setVal(true, nullptr);
	} else if (getNodeVar(root).isFalse()) {
		return;  // Will fail anyway because of unreachability.
	}
	last_state_n[root] = VT_IN;
	add_innode(root);

	for (int i = 0; i < nbNodes(); i++) {
		remove_deg1(i);
	}
}